

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSplitQName(void)

{
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr val;
  xmlChar *val_00;
  xmlChar *val_01;
  int local_44;
  int n_prefix;
  xmlChar **prefix;
  int n_name;
  xmlChar *name;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  xmlChar *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 3; name._4_4_ = name._4_4_ + 1) {
    for (prefix._4_4_ = 0; (int)prefix._4_4_ < 5; prefix._4_4_ = prefix._4_4_ + 1) {
      for (local_44 = 0; local_44 < 1; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlParserCtxtPtr(name._4_4_,0);
        val_00 = gen_const_xmlChar_ptr(prefix._4_4_,1);
        val_01 = (xmlChar *)xmlSplitQName(val,val_00,0);
        desret_xmlChar_ptr(val_01);
        call_tests = call_tests + 1;
        des_xmlParserCtxtPtr(name._4_4_,val,0);
        des_const_xmlChar_ptr(prefix._4_4_,val_00,1);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSplitQName",(ulong)(uint)(iVar2 - iVar1));
          ret_val._4_4_ = ret_val._4_4_ + 1;
          printf(" %d",(ulong)name._4_4_);
          printf(" %d",(ulong)prefix._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlSplitQName(void) {
    int test_ret = 0;

    int mem_base;
    xmlChar * ret_val;
    xmlParserCtxtPtr ctxt; /* an XML parser context */
    int n_ctxt;
    xmlChar * name; /* an XML parser context */
    int n_name;
    xmlChar ** prefix; /* a xmlChar ** */
    int n_prefix;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_prefix = 0;n_prefix < gen_nb_xmlChar_ptr_ptr;n_prefix++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);
        prefix = gen_xmlChar_ptr_ptr(n_prefix, 2);

        ret_val = xmlSplitQName(ctxt, (const xmlChar *)name, prefix);
        desret_xmlChar_ptr(ret_val);
        call_tests++;
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_const_xmlChar_ptr(n_name, (const xmlChar *)name, 1);
        des_xmlChar_ptr_ptr(n_prefix, prefix, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSplitQName",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_name);
            printf(" %d", n_prefix);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}